

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall
LineSplitter_SingleStringFollowedByCr_Test::TestBody
          (LineSplitter_SingleStringFollowedByCr_Test *this)

{
  pointer *this_00;
  bool bVar1;
  extent_type<_1L> __n;
  char *message;
  void *__buf;
  span<const_char,__1L> chars;
  AssertHelper local_298;
  Message local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  AssertionResult gtest_ar;
  ostringstream out;
  undefined1 local_e0 [8];
  array arr;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_b8;
  element_type local_a1 [1];
  extent_type<_1L> eStack_a0;
  char cr [1];
  not_null<std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_*>
  local_90;
  undefined1 local_88 [8];
  line_splitter ls;
  allocator local_49;
  undefined1 local_48 [8];
  string str;
  container container;
  LineSplitter_SingleStringFollowedByCr_Test *this_local;
  
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            *)((long)&str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"hello",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pstore::gsl::
  not_null<std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_*>
  ::not_null(&local_90,
             (vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)((long)&str.field_2 + 8));
  pstore::dump::line_splitter::line_splitter((line_splitter *)local_88,local_90);
  chars = pstore::gsl::make_span<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  __n = chars.storage_.super_extent_type<_1L>.size_;
  eStack_a0.size_ = __n.size_;
  pstore::dump::line_splitter::append((line_splitter *)local_88,chars);
  local_a1[0] = '\n';
  this_00 = &arr.values_.
             super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pstore::gsl::span<char_const,1l>::span<1ul>((span<char_const,1l> *)this_00,&local_a1);
  pstore::gsl::span<char_const,-1l>::span<char_const,1l>
            ((span<char_const,_1l> *)&local_b8,(span<const_char,_1L> *)this_00);
  pstore::dump::line_splitter::append((line_splitter *)local_88,(span<const_char,__1L>)local_b8);
  pstore::dump::array::array((array *)local_e0,(container *)((long)&str.field_2 + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gtest_ar.message_);
  pstore::dump::value::write((value *)local_e0,(int)&gtest_ar + 8,__buf,__n.size_);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_268,"out.str ()","\"\\n- hello\"",&local_288,
             (char (*) [9])"\n- hello");
  std::__cxx11::string::~string((string *)&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_line_splitter.cpp"
               ,0x65,message);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gtest_ar.message_);
  pstore::dump::array::~array((array *)local_e0);
  pstore::dump::line_splitter::~line_splitter((line_splitter *)local_88);
  std::__cxx11::string::~string((string *)local_48);
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             *)((long)&str.field_2 + 8));
  return;
}

Assistant:

TEST (LineSplitter, SingleStringFollowedByCr) {
    using namespace pstore::dump;

    array::container container;
    std::string const str = "hello";

    line_splitter ls (&container);
    ls.append (pstore::gsl::make_span (str));
    char const cr[1] = {'\n'};
    ls.append (pstore::gsl::span<char const, 1U>{cr});

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello");
}